

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

size_t __thiscall clickhouse::BufferedInput::DoNext(BufferedInput *this,void **ptr,size_t len)

{
  bool bVar1;
  uchar *buf;
  size_t sVar2;
  long in_RDI;
  void **in_stack_ffffffffffffffb8;
  InputStream *in_stack_ffffffffffffffc0;
  
  bVar1 = ArrayInput::Exhausted((ArrayInput *)0x1e6b86);
  if (bVar1) {
    buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e6ba6);
    in_stack_ffffffffffffffc0 = *(InputStream **)(in_RDI + 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e6bc2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x28));
    sVar2 = InputStream::Read(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x1e6be7);
    ArrayInput::Reset((ArrayInput *)(in_RDI + 0x10),buf,sVar2);
  }
  sVar2 = ZeroCopyInput::Next((ZeroCopyInput *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                              0x1e6c11);
  return sVar2;
}

Assistant:

size_t BufferedInput::DoNext(const void** ptr, size_t len)  {
    if (array_input_.Exhausted()) {
        array_input_.Reset(
            buffer_.data(), slave_->Read(buffer_.data(), buffer_.size())
        );
    }

    return array_input_.Next(ptr, len);
}